

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_emu.c
# Opt level: O1

void gb_emu_reset(gb_emu_t *gb_emu)

{
  if (gb_emu != (gb_emu_t *)0x0) {
    cpu_reset((gb_cpu_t *)gb_emu);
    mmu_reset(&(gb_emu->gb).mmu);
    ppu_reset(&(gb_emu->gb).ppu);
    int_reset(&(gb_emu->gb).intr_ctrl);
    timer_reset(&(gb_emu->gb).timer);
    joypad_reset(&(gb_emu->gb).joypad);
    return;
  }
  __assert_fail("gb_emu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/gb_emu.c"
                ,0x5e,"void gb_emu_reset(gb_emu_t *)");
}

Assistant:

void gb_emu_reset(gb_emu_t *gb_emu)
{
    assert(gb_emu != NULL);

    gb_t *gb = &gb_emu->gb;

    cpu_reset(&gb->cpu);
    mmu_reset(&gb->mmu);
    ppu_reset(&gb->ppu);
    int_reset(&gb->intr_ctrl);
    timer_reset(&gb->timer);
    joypad_reset(&gb->joypad);
    // MMU resets inserted cartridge
}